

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

string * __thiscall
google::protobuf::FieldDescriptorProto::mutable_name_abi_cxx11_(FieldDescriptorProto *this)

{
  string *this_00;
  FieldDescriptorProto *this_local;
  
  set_has_name(this);
  if (this->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00);
    this->name_ = this_00;
  }
  return this->name_;
}

Assistant:

inline ::std::string* FieldDescriptorProto::mutable_name() {
  set_has_name();
  if (name_ == &::google::protobuf::internal::kEmptyString) {
    name_ = new ::std::string;
  }
  return name_;
}